

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

uint32_t arm_fi_to_sfsc(ARMMMUFaultInfo_conflict1 *fi)

{
  ARMFaultType AVar1;
  
  AVar1 = fi->type;
  switch(AVar1) {
  case ARMFault_None:
    goto switchD_0061bb92_caseD_0;
  case ARMFault_AccessFlag:
    AVar1 = (uint)(fi->level != 1) * 3 + ARMFault_Background;
    break;
  case ARMFault_Alignment:
    AVar1 = ARMFault_AccessFlag;
    break;
  case ARMFault_Background:
    AVar1 = ARMFault_None;
    break;
  case ARMFault_Domain:
    AVar1 = (uint)(fi->level != 1) * 2 + ARMFault_SyncExternalOnWalk;
    break;
  case ARMFault_Permission:
    AVar1 = (uint)(fi->level != 1) * 2 + ARMFault_AsyncExternal;
    break;
  case ARMFault_Translation:
    AVar1 = (uint)(fi->level != 1) * 2 + ARMFault_Permission;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,0x2a3,(char *)0x0);
  case ARMFault_SyncExternal:
    AVar1 = (uint)fi->ea << 0xc | ARMFault_SyncExternal;
    break;
  case ARMFault_SyncExternalOnWalk:
    AVar1 = (uint)fi->ea * 0x1000 + (uint)(fi->level != 1) * 2 + ARMFault_AsyncParity;
    break;
  case ARMFault_SyncParity:
    AVar1 = 0x409;
    break;
  case ARMFault_SyncParityOnWalk:
    AVar1 = (uint)(fi->level != 1) * 2 + 0x40c;
    break;
  case ARMFault_AsyncParity:
    AVar1 = 0x408;
    break;
  case ARMFault_AsyncExternal:
    AVar1 = (uint)fi->ea << 0xc | 0x406;
    break;
  case ARMFault_Debug:
    AVar1 = ARMFault_Alignment;
    break;
  case ARMFault_TLBConflict:
    AVar1 = 0x400;
    break;
  case ARMFault_Lockdown:
    AVar1 = 0x404;
    break;
  case ARMFault_Exclusive:
    AVar1 = 0x405;
    break;
  case ARMFault_ICacheMaint:
    AVar1 = ARMFault_Domain;
    break;
  case ARMFault_QEMU_NSCExec:
    AVar1 = ARMFault_TLBConflict;
    break;
  case ARMFault_QEMU_SFault:
    AVar1 = ARMFault_Debug;
  }
  AVar1 = fi->domain << 4 | AVar1;
switchD_0061bb92_caseD_0:
  return AVar1;
}

Assistant:

static inline uint32_t arm_fi_to_sfsc(ARMMMUFaultInfo *fi)
{
    uint32_t fsc = 0;

    switch (fi->type) {
    case ARMFault_None:
        return 0;
    case ARMFault_AccessFlag:
        fsc = fi->level == 1 ? 0x3 : 0x6;
        break;
    case ARMFault_Alignment:
        fsc = 0x1;
        break;
    case ARMFault_Permission:
        fsc = fi->level == 1 ? 0xd : 0xf;
        break;
    case ARMFault_Domain:
        fsc = fi->level == 1 ? 0x9 : 0xb;
        break;
    case ARMFault_Translation:
        fsc = fi->level == 1 ? 0x5 : 0x7;
        break;
    case ARMFault_SyncExternal:
        fsc = 0x8 | (fi->ea << 12);
        break;
    case ARMFault_SyncExternalOnWalk:
        fsc = fi->level == 1 ? 0xc : 0xe;
        fsc |= (fi->ea << 12);
        break;
    case ARMFault_SyncParity:
        fsc = 0x409;
        break;
    case ARMFault_SyncParityOnWalk:
        fsc = fi->level == 1 ? 0x40c : 0x40e;
        break;
    case ARMFault_AsyncParity:
        fsc = 0x408;
        break;
    case ARMFault_AsyncExternal:
        fsc = 0x406 | (fi->ea << 12);
        break;
    case ARMFault_Debug:
        fsc = 0x2;
        break;
    case ARMFault_TLBConflict:
        fsc = 0x400;
        break;
    case ARMFault_Lockdown:
        fsc = 0x404;
        break;
    case ARMFault_Exclusive:
        fsc = 0x405;
        break;
    case ARMFault_ICacheMaint:
        fsc = 0x4;
        break;
    case ARMFault_Background:
        fsc = 0x0;
        break;
    case ARMFault_QEMU_NSCExec:
        fsc = M_FAKE_FSR_NSC_EXEC;
        break;
    case ARMFault_QEMU_SFault:
        fsc = M_FAKE_FSR_SFAULT;
        break;
    default:
        /* Other faults can't occur in a context that requires a
         * short-format status code.
         */
        g_assert_not_reached();
        break;
    }

    fsc |= (fi->domain << 4);
    return fsc;
}